

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

int main(int argc,char **argv)

{
  short sVar1;
  pointer pcVar2;
  pointer pbVar3;
  ostream *poVar4;
  long *plVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  mapped_type *pmVar7;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> marker_name;
  value_type c3d_data;
  value_type reference_data;
  C3DFile c3dfile;
  C3DFile reference_file;
  key_type local_710;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *local_6f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *local_6e8;
  FloatMarkerData local_6e0;
  FloatMarkerData local_668;
  C3DFile local_5f0;
  C3DFile local_310;
  
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  C3DFile::load(&local_310,"../data/slackline0000_all_written.c3d");
  C3DFile::load(&local_5f0,"../data/slackline0000_all.c3d");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value Name",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Original",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reference",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header first",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.first_parameter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.first_parameter);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header id",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.c3d_id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.c3d_id);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header Num Mark",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.num_markers);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.num_markers);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header Ana Chan",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.analog_channels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.analog_channels);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header 1. frame",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.first_frame);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.first_frame);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header last frame",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.last_frame);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.last_frame);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Header max int gap",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(uint)local_5f0.header.max_interpolation_gap);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.max_interpolation_gap);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Header scale_factor",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = std::ostream::_M_insert<double>((double)local_5f0.header.scale_factor);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  poVar4 = std::ostream::_M_insert<double>((double)local_310.header.scale_factor);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header start rec",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.start_record);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.start_record);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Header ana cha sam",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(uint)local_5f0.header.analog_channels_samples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.analog_channels_samples);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header vid sam ra",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = std::ostream::_M_insert<double>((double)local_5f0.header.video_sampling_rate);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  poVar4 = std::ostream::_M_insert<double>((double)local_310.header.video_sampling_rate);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header key val la",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.key_value_label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.key_value_label);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Header bl lab strt",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.block_label_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.block_label_start);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header 4 events",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(uint)local_5f0.header.key_value_char_4_events);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.key_value_char_4_events);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header num evnt",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(uint)local_5f0.header.num_events);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)local_310.header.num_events);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Marker_name",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tLoaded Values",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tReference Values",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pbVar3 = local_310.point_label.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_310.point_label.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_310.point_label.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_6e8 = &local_310.label_point_map;
    local_6f0 = &local_5f0.label_point_map;
    pbVar8 = local_310.point_label.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_710,pcVar2,pcVar2 + pbVar8->_M_string_length);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_5f0.point_label.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_5f0.point_label.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_710);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](local_6e8,&local_710);
      sVar1 = *pmVar7;
      FloatMarkerData::FloatMarkerData
                (&local_668,
                 local_310.float_point_data.
                 super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar1);
      if (_Var6._M_current ==
          local_5f0.point_label.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Dafug Happend ",0xe);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_710._M_dataplus._M_p,
                            local_710._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      else {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
        ::operator[](local_6f0,&local_710);
        FloatMarkerData::FloatMarkerData
                  (&local_6e0,
                   local_5f0.float_point_data.
                   super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "------------------------------------------------------------------------------",
                   0x4e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_6e0.x.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_668.x.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_710._M_dataplus._M_p,
                            local_710._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_6e0.y.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_668.y.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_6e0.z.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>
                           ((double)*local_668.z.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "------------------------------------------------------------------------------",
                   0x4e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        if (local_6e0.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6e0.residual.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6e0.residual.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6e0.residual.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_6e0.cameras.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6e0.cameras.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6e0.cameras.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6e0.cameras.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_6e0.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_6e0.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6e0.z.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6e0.z.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_6e0.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_6e0.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6e0.y.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6e0.y.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_6e0.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_6e0.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6e0.x.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6e0.x.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_668.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_668.residual.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_668.residual.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_668.residual.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_668.cameras.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_668.cameras.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_668.cameras.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_668.cameras.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_668.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_668.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_668.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_668.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_668.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_668.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_668.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_668.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_668.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_668.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_668.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_668.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_dataplus._M_p != &local_710.field_2) {
        operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar3);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_310.group_id_to_index_map._M_t);
  std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::~vector
            (&local_310.float_point_data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  ::~_Rb_tree(&local_310.label_point_map._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_310.point_label);
  std::
  vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ::~vector(&local_310.point_data);
  std::vector<GroupInfo,_std::allocator<GroupInfo>_>::~vector(&local_310.group_infos);
  std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::~vector(&local_310.param_infos);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_5f0.group_id_to_index_map._M_t);
  std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::~vector
            (&local_5f0.float_point_data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  ::~_Rb_tree(&local_5f0.label_point_map._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f0.point_label);
  std::
  vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ::~vector(&local_5f0.point_data);
  std::vector<GroupInfo,_std::allocator<GroupInfo>_>::~vector(&local_5f0.group_infos);
  std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::~vector(&local_5f0.param_infos);
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
	const char* reference = "../data/slackline0000_all_written.c3d";
	const char* xsens_c3d = "../data/slackline0000_all.c3d";
	C3DFile c3dfile, reference_file;
	reference_file.load (reference);
	c3dfile.load (xsens_c3d);
	

	cout << "Value Name" << "\t\t" << "Original" << "\t" << "Reference" << endl;
	//compare header
	cout << "Header first" << "\t\t" << (int)c3dfile.header.first_parameter << "\t\t" << (int)reference_file.header.first_parameter << endl;
	cout << "Header id" << "\t\t" << (int)c3dfile.header.c3d_id<< "\t\t" << (int)reference_file.header.c3d_id<< endl;
	cout << "Header Num Mark" << "\t\t" << (int)c3dfile.header.num_markers<< "\t\t" << (int)reference_file.header.num_markers<< endl;
	cout << "Header Ana Chan" << "\t\t" << (int)c3dfile.header.analog_channels<< "\t\t" << (int)reference_file.header.analog_channels<< endl;
	cout << "Header 1. frame" << "\t\t" << (int)c3dfile.header.first_frame<< "\t\t" << (int)reference_file.header.first_frame<< endl;
	cout << "Header last frame" << "\t" << (int)c3dfile.header.last_frame<< "\t\t" << (int)reference_file.header.last_frame<< endl;
	cout << "Header max int gap" << "\t" << (int)c3dfile.header.max_interpolation_gap<< "\t\t" << (int)reference_file.header.max_interpolation_gap<< endl;
	cout << "Header scale_factor" << "\t" << (float)c3dfile.header.scale_factor<< "\t\t" << (float)reference_file.header.scale_factor<< endl;
	cout << "Header start rec" << "\t" << (int)c3dfile.header.start_record<< "\t\t" << (int)reference_file.header.start_record<< endl;
	cout << "Header ana cha sam" << "\t" << (int)c3dfile.header.analog_channels_samples<< "\t\t" << (int)reference_file.header.analog_channels_samples<< endl;
	cout << "Header vid sam ra" << "\t" << (float)c3dfile.header.video_sampling_rate<< "\t\t" << (float)reference_file.header.video_sampling_rate<< endl;
	cout << "Header key val la" << "\t" << (int)c3dfile.header.key_value_label<< "\t\t" << (int)reference_file.header.key_value_label<< endl;
	cout << "Header bl lab strt" << "\t" << (int)c3dfile.header.block_label_start<< "\t\t" << (int)reference_file.header.block_label_start<< endl;
	cout << "Header 4 events" << "\t\t" << (int)c3dfile.header.key_value_char_4_events<< "\t\t" << (int)reference_file.header.key_value_char_4_events<< endl;
	cout << "Header num evnt" << "\t\t" << (int)c3dfile.header.num_events<< "\t\t" << (int)reference_file.header.num_events<< endl;

	cout << endl << "Marker_name" << "\tLoaded Values" << "\tReference Values" << endl;

	for (auto marker_name : reference_file.point_label) {
		auto elem = find(c3dfile.point_label.begin(), c3dfile.point_label.end(), marker_name);
		Sint16 pi = reference_file.label_point_map[marker_name];
		auto reference_data = reference_file.float_point_data[pi];
		if( elem != c3dfile.point_label.end() ) {
			Sint16 cpi = c3dfile.label_point_map[marker_name];
			auto c3d_data = c3dfile.float_point_data[pi];
			cout << "------------------------------------------------------------------------------" << endl;
			cout << "\t\t"<< c3d_data.x[0] << "\t" << reference_data.x[0] << endl;
			cout << marker_name << "\t" << c3d_data.y[0] << "\t" << reference_data.y[0] << endl;
			cout << "\t\t"<< c3d_data.z[0] << "\t" << reference_data.z[0] << endl;
			cout << "------------------------------------------------------------------------------" << endl;
		} else {
			cout << "Dafug Happend "<< marker_name << endl;
		}
	}


	return 0;
}